

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_2_3
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  int32_t scale;
  int32_t *piVar1;
  bool bVar2;
  int32_t sum2;
  int32_t sum1;
  int32_t sum0;
  
  piVar1 = output->data + 2;
  while (bVar2 = numsamples != 0, numsamples = numsamples - 1, bVar2) {
    sum0 = 0;
    sum1 = 0;
    sum2 = 0;
    if ((this->m_sampindex & 1) == 0) {
      clock_and_add(this,&sum0,&sum1,&sum2,2);
      scale = 1;
    }
    else {
      sum0 = (this->m_last).data[0];
      sum1 = (this->m_last).data[1];
      sum2 = (this->m_last).data[2];
      scale = 2;
    }
    clock_and_add(this,&sum0,&sum1,&sum2,scale);
    *piVar1 = ((sum1 + sum0 + sum2) * 2) / 9;
    this->m_sampindex = this->m_sampindex + 1;
    piVar1 = piVar1 + 3;
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_2_3(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		if (bitfield(m_sampindex, 0) == 0)
		{
			clock_and_add(sum0, sum1, sum2, 2);
			clock_and_add(sum0, sum1, sum2, 1);
		}
		else
		{
			add_last(sum0, sum1, sum2, 1);
			clock_and_add(sum0, sum1, sum2, 2);
		}
		write_to_output(output, sum0, sum1, sum2, 3);
	}
}